

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

int google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingFileError_Test::
    AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest>
  *this_01;
  TestMetaFactoryBase<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"DescriptorDatabaseTest",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x19b);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::
  TestMetaFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingFileError_Test>
  ::TestMetaFactory((TestMetaFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingFileError_Test>
                     *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x19b);
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest>::
  AddTestPattern(this_01,"DescriptorDatabaseTest","ConflictingFileError",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingFileError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "}");
}